

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_index.cpp
# Opt level: O0

int __thiscall BamTools::IndexTool::Run(IndexTool *this,int argc,char **argv)

{
  bool bVar1;
  IndexToolPrivate *this_00;
  long in_RDI;
  int in_stack_000003c4;
  char **in_stack_000003c8;
  int in_stack_000003d4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  Options::Parse(in_stack_000003d4,in_stack_000003c8,in_stack_000003c4);
  this_00 = (IndexToolPrivate *)operator_new(8);
  IndexToolPrivate::IndexToolPrivate(this_00,*(IndexSettings **)(in_RDI + 8));
  *(IndexToolPrivate **)(in_RDI + 0x10) = this_00;
  bVar1 = IndexToolPrivate::Run
                    ((IndexToolPrivate *)
                     CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  return (uint)!bVar1;
}

Assistant:

int IndexTool::Run(int argc, char* argv[])
{

    // parse command line arguments
    Options::Parse(argc, argv, 1);

    // initialize IndexTool with settings
    m_impl = new IndexToolPrivate(m_settings);

    // run IndexTool, return success/fail
    if (m_impl->Run())
        return 0;
    else
        return 1;
}